

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O3

int Abc_NtkVerifyCex(Abc_Ntk_t *pNtk,Abc_Cex_t *p)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  Abc_Obj_t *pAVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  Vec_Ptr_t *pVVar10;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcLatch.c"
                  ,0x2df,"int Abc_NtkVerifyCex(Abc_Ntk_t *, Abc_Cex_t *)");
  }
  if (p->nPis != pNtk->vPis->nSize) {
    __assert_fail("p->nPis == Abc_NtkPiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcLatch.c"
                  ,0x2e0,"int Abc_NtkVerifyCex(Abc_Ntk_t *, Abc_Cex_t *)");
  }
  Abc_NtkCleanMarkC(pNtk);
  pAVar6 = Abc_AigConst1(pNtk);
  pAVar6->field_0x14 = pAVar6->field_0x14 | 0x40;
  uVar5 = p->nRegs;
  if (-1 < p->iFrame) {
    iVar8 = 0;
    do {
      pVVar10 = pNtk->vPis;
      if (0 < pVVar10->nSize) {
        lVar9 = 0;
        do {
          *(uint *)((long)pVVar10->pArray[lVar9] + 0x14) =
               *(uint *)((long)pVVar10->pArray[lVar9] + 0x14) & 0xffffffbf |
               ((uint)(&p[1].iPo)[(int)((ulong)uVar5 + lVar9) >> 5] >>
                ((byte)((ulong)uVar5 + lVar9) & 0x1f) & 1) << 6;
          lVar9 = lVar9 + 1;
          pVVar10 = pNtk->vPis;
        } while (lVar9 < pVVar10->nSize);
        uVar5 = uVar5 + (int)lVar9;
      }
      pVVar10 = pNtk->vObjs;
      if (0 < pVVar10->nSize) {
        lVar9 = 0;
        do {
          plVar2 = (long *)pVVar10->pArray[lVar9];
          if ((plVar2 != (long *)0x0) &&
             (uVar1 = *(uint *)((long)plVar2 + 0x14), (uVar1 & 0xf) == 7)) {
            lVar7 = *(long *)(*(long *)(*plVar2 + 0x20) + 8);
            *(uint *)((long)plVar2 + 0x14) =
                 uVar1 & 0xffffffb7 |
                 ((uVar1 >> 0xb ^
                  *(uint *)(*(long *)(lVar7 + (long)((int *)plVar2[4])[1] * 8) + 0x14) >> 6) &
                  (uVar1 >> 10 ^
                  *(uint *)(*(long *)(lVar7 + (long)*(int *)plVar2[4] * 8) + 0x14) >> 6) & 1) << 6;
            pVVar10 = pNtk->vObjs;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < pVVar10->nSize);
      }
      pVVar10 = pNtk->vCos;
      if (0 < pVVar10->nSize) {
        lVar9 = 0;
        do {
          plVar2 = (long *)pVVar10->pArray[lVar9];
          *(uint *)((long)plVar2 + 0x14) =
               *(uint *)((long)plVar2 + 0x14) & 0xffffffbf |
               (*(uint *)((long)plVar2 + 0x14) >> 4 ^
               *(uint *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                  (long)*(int *)plVar2[4] * 8) + 0x14)) & 0x40;
          lVar9 = lVar9 + 1;
          pVVar10 = pNtk->vCos;
        } while (lVar9 < pVVar10->nSize);
      }
      pVVar10 = pNtk->vBoxes;
      if (0 < pVVar10->nSize) {
        lVar9 = 0;
        do {
          plVar2 = (long *)pVVar10->pArray[lVar9];
          if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
            lVar7 = *(long *)(*(long *)(*plVar2 + 0x20) + 8);
            lVar3 = *(long *)(lVar7 + (long)*(int *)plVar2[6] * 8);
            *(uint *)(lVar3 + 0x14) =
                 *(uint *)(lVar3 + 0x14) & 0xffffffbf |
                 *(uint *)(*(long *)(lVar7 + (long)*(int *)plVar2[4] * 8) + 0x14) & 0x40;
            pVVar10 = pNtk->vBoxes;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < pVVar10->nSize);
      }
      bVar4 = iVar8 < p->iFrame;
      iVar8 = iVar8 + 1;
    } while (bVar4);
  }
  if (uVar5 != p->nBits) {
    __assert_fail("iBit == p->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcLatch.c"
                  ,0x2f5,"int Abc_NtkVerifyCex(Abc_Ntk_t *, Abc_Cex_t *)");
  }
  lVar9 = (long)pNtk->vPos->nSize;
  iVar8 = -1;
  if (0 < lVar9) {
    lVar7 = 0;
    do {
      if ((*(byte *)((long)pNtk->vPos->pArray[lVar7] + 0x14) & 0x40) != 0) {
        iVar8 = (int)lVar7;
        break;
      }
      lVar7 = lVar7 + 1;
    } while (lVar9 != lVar7);
  }
  Abc_NtkCleanMarkC(pNtk);
  return iVar8;
}

Assistant:

int Abc_NtkVerifyCex( Abc_Ntk_t * pNtk, Abc_Cex_t * p )
{
    Abc_Obj_t * pObj;
    int RetValue, i, k, iBit = 0;
    assert( Abc_NtkIsStrash(pNtk) );
    assert( p->nPis  == Abc_NtkPiNum(pNtk) );
//    assert( p->nRegs == Abc_NtkLatchNum(pNtk) );
    Abc_NtkCleanMarkC( pNtk );
    Abc_AigConst1(pNtk)->fMarkC = 1;
    // initialize flops
//    Abc_NtkForEachLatch( pNtk, pObj, i )
//        Abc_ObjFanout0(pObj)->fMarkC = Abc_InfoHasBit(p->pData, iBit++);
    // simulate timeframes
    iBit = p->nRegs;
    for ( i = 0; i <= p->iFrame; i++ )
    {
        Abc_NtkForEachPi( pNtk, pObj, k )
            pObj->fMarkC = Abc_InfoHasBit(p->pData, iBit++);
        Abc_NtkForEachNode( pNtk, pObj, k )
            pObj->fMarkC = (Abc_ObjFanin0(pObj)->fMarkC ^ Abc_ObjFaninC0(pObj)) & 
                           (Abc_ObjFanin1(pObj)->fMarkC ^ Abc_ObjFaninC1(pObj));
        Abc_NtkForEachCo( pNtk, pObj, k )
            pObj->fMarkC = Abc_ObjFanin0(pObj)->fMarkC ^ Abc_ObjFaninC0(pObj);
        Abc_NtkForEachLatch( pNtk, pObj, k )
            Abc_ObjFanout0(pObj)->fMarkC = Abc_ObjFanin0(pObj)->fMarkC;
    }
    assert( iBit == p->nBits );
    // figure out the number of failed output
    RetValue = -1;
    Abc_NtkForEachPo( pNtk, pObj, i )
	{
        if ( pObj->fMarkC )
        {
            RetValue = i;
            break;
        }
	}
    Abc_NtkCleanMarkC( pNtk );
    return RetValue;
}